

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

CompressionFunction *
duckdb::RLEFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  code *pcVar2;
  InternalException *this;
  undefined7 in_register_00000031;
  string local_40;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = BOOL;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<signed_char>;
    __return_storage_ptr__->analyze = RLEAnalyze<signed_char>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<signed_char>;
    __return_storage_ptr__->init_compression = RLEInitCompression<signed_char,true>;
    __return_storage_ptr__->compress = RLECompress<signed_char,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<signed_char,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<signed_char>;
    __return_storage_ptr__->scan_vector = RLEScan<signed_char>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<signed_char>;
    __return_storage_ptr__->select = RLESelect<signed_char>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<signed_char>;
    __return_storage_ptr__->skip = RLESkip<signed_char>;
    __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
    __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
    __return_storage_ptr__->append = (compression_append_t)0x0;
    __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
    __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
    __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
    __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
    __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
    __return_storage_ptr__->filter = (compression_filter_t)0x0;
    return __return_storage_ptr__;
  case 2:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = UINT8;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<unsigned_char>;
    __return_storage_ptr__->analyze = RLEAnalyze<unsigned_char>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<unsigned_char>;
    __return_storage_ptr__->init_compression = RLEInitCompression<unsigned_char,true>;
    __return_storage_ptr__->compress = RLECompress<unsigned_char,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<unsigned_char,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<unsigned_char>;
    __return_storage_ptr__->scan_vector = RLEScan<unsigned_char>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<unsigned_char>;
    __return_storage_ptr__->select = RLESelect<unsigned_char>;
    __return_storage_ptr__->filter = RLEFilter<unsigned_char>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<unsigned_char>;
    pcVar2 = RLESkip<unsigned_char>;
    break;
  case 3:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = INT8;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<signed_char>;
    __return_storage_ptr__->analyze = RLEAnalyze<signed_char>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<signed_char>;
    __return_storage_ptr__->init_compression = RLEInitCompression<signed_char,true>;
    __return_storage_ptr__->compress = RLECompress<signed_char,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<signed_char,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<signed_char>;
    __return_storage_ptr__->scan_vector = RLEScan<signed_char>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<signed_char>;
    __return_storage_ptr__->select = RLESelect<signed_char>;
    __return_storage_ptr__->filter = RLEFilter<signed_char>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<signed_char>;
    pcVar2 = RLESkip<signed_char>;
    break;
  case 4:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = UINT16;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<unsigned_short>;
    __return_storage_ptr__->analyze = RLEAnalyze<unsigned_short>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<unsigned_short>;
    __return_storage_ptr__->init_compression = RLEInitCompression<unsigned_short,true>;
    __return_storage_ptr__->compress = RLECompress<unsigned_short,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<unsigned_short,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<unsigned_short>;
    __return_storage_ptr__->scan_vector = RLEScan<unsigned_short>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<unsigned_short>;
    __return_storage_ptr__->select = RLESelect<unsigned_short>;
    __return_storage_ptr__->filter = RLEFilter<unsigned_short>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<unsigned_short>;
    pcVar2 = RLESkip<unsigned_short>;
    break;
  case 5:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = INT16;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<short>;
    __return_storage_ptr__->analyze = RLEAnalyze<short>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<short>;
    __return_storage_ptr__->init_compression = RLEInitCompression<short,true>;
    __return_storage_ptr__->compress = RLECompress<short,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<short,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<short>;
    __return_storage_ptr__->scan_vector = RLEScan<short>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<short>;
    __return_storage_ptr__->select = RLESelect<short>;
    __return_storage_ptr__->filter = RLEFilter<short>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<short>;
    pcVar2 = RLESkip<short>;
    break;
  case 6:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = UINT32;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<unsigned_int>;
    __return_storage_ptr__->analyze = RLEAnalyze<unsigned_int>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<unsigned_int>;
    __return_storage_ptr__->init_compression = RLEInitCompression<unsigned_int,true>;
    __return_storage_ptr__->compress = RLECompress<unsigned_int,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<unsigned_int,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<unsigned_int>;
    __return_storage_ptr__->scan_vector = RLEScan<unsigned_int>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<unsigned_int>;
    __return_storage_ptr__->select = RLESelect<unsigned_int>;
    __return_storage_ptr__->filter = RLEFilter<unsigned_int>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<unsigned_int>;
    pcVar2 = RLESkip<unsigned_int>;
    break;
  case 7:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = INT32;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<int>;
    __return_storage_ptr__->analyze = RLEAnalyze<int>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<int>;
    __return_storage_ptr__->init_compression = RLEInitCompression<int,true>;
    __return_storage_ptr__->compress = RLECompress<int,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<int,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<int>;
    __return_storage_ptr__->scan_vector = RLEScan<int>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<int>;
    __return_storage_ptr__->select = RLESelect<int>;
    __return_storage_ptr__->filter = RLEFilter<int>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<int>;
    pcVar2 = RLESkip<int>;
    break;
  case 8:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = UINT64;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<unsigned_long>;
    __return_storage_ptr__->analyze = RLEAnalyze<unsigned_long>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<unsigned_long>;
    __return_storage_ptr__->init_compression = RLEInitCompression<unsigned_long,true>;
    __return_storage_ptr__->compress = RLECompress<unsigned_long,true>;
    pcVar2 = RLEFinalizeCompress<unsigned_long,true>;
    goto LAB_0105ecf8;
  case 9:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = INT64;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<long>;
    __return_storage_ptr__->analyze = RLEAnalyze<long>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<long>;
    __return_storage_ptr__->init_compression = RLEInitCompression<long,true>;
    __return_storage_ptr__->compress = RLECompress<long,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<long,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<long>;
    __return_storage_ptr__->scan_vector = RLEScan<long>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<long>;
    __return_storage_ptr__->select = RLESelect<long>;
    __return_storage_ptr__->filter = RLEFilter<long>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<long>;
    pcVar2 = RLESkip<long>;
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
switchD_0105e6b0_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported type for RLE","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = FLOAT;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<float>;
    __return_storage_ptr__->analyze = RLEAnalyze<float>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<float>;
    __return_storage_ptr__->init_compression = RLEInitCompression<float,true>;
    __return_storage_ptr__->compress = RLECompress<float,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<float,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<float>;
    __return_storage_ptr__->scan_vector = RLEScan<float>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<float>;
    __return_storage_ptr__->select = RLESelect<float>;
    __return_storage_ptr__->filter = RLEFilter<float>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<float>;
    pcVar2 = RLESkip<float>;
    break;
  case 0xc:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = DOUBLE;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<double>;
    __return_storage_ptr__->analyze = RLEAnalyze<double>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<double>;
    __return_storage_ptr__->init_compression = RLEInitCompression<double,true>;
    __return_storage_ptr__->compress = RLECompress<double,true>;
    __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<double,true>;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<double>;
    __return_storage_ptr__->scan_vector = RLEScan<double>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<double>;
    __return_storage_ptr__->select = RLESelect<double>;
    __return_storage_ptr__->filter = RLEFilter<double>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<double>;
    pcVar2 = RLESkip<double>;
    break;
  case 0x17:
    __return_storage_ptr__->type = COMPRESSION_RLE;
    __return_storage_ptr__->data_type = LIST;
    __return_storage_ptr__->init_analyze = RLEInitAnalyze<unsigned_long>;
    __return_storage_ptr__->analyze = RLEAnalyze<unsigned_long>;
    __return_storage_ptr__->final_analyze = RLEFinalAnalyze<unsigned_long>;
    __return_storage_ptr__->init_compression = RLEInitCompression<unsigned_long,false>;
    __return_storage_ptr__->compress = RLECompress<unsigned_long,false>;
    pcVar2 = RLEFinalizeCompress<unsigned_long,false>;
LAB_0105ecf8:
    __return_storage_ptr__->compress_finalize = pcVar2;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = RLEInitScan<unsigned_long>;
    __return_storage_ptr__->scan_vector = RLEScan<unsigned_long>;
    __return_storage_ptr__->scan_partial = RLEScanPartial<unsigned_long>;
    __return_storage_ptr__->select = RLESelect<unsigned_long>;
    __return_storage_ptr__->filter = RLEFilter<unsigned_long>;
    __return_storage_ptr__->fetch_row = RLEFetchRow<unsigned_long>;
    pcVar2 = RLESkip<unsigned_long>;
    break;
  default:
    if (iVar1 == 0xcb) {
      __return_storage_ptr__->type = COMPRESSION_RLE;
      __return_storage_ptr__->data_type = UINT128;
      __return_storage_ptr__->init_analyze = RLEInitAnalyze<duckdb::uhugeint_t>;
      __return_storage_ptr__->analyze = RLEAnalyze<duckdb::uhugeint_t>;
      __return_storage_ptr__->final_analyze = RLEFinalAnalyze<duckdb::uhugeint_t>;
      __return_storage_ptr__->init_compression = RLEInitCompression<duckdb::uhugeint_t,true>;
      __return_storage_ptr__->compress = RLECompress<duckdb::uhugeint_t,true>;
      __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<duckdb::uhugeint_t,true>;
      __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
      __return_storage_ptr__->init_scan = RLEInitScan<duckdb::uhugeint_t>;
      __return_storage_ptr__->scan_vector = RLEScan<duckdb::uhugeint_t>;
      __return_storage_ptr__->scan_partial = RLEScanPartial<duckdb::uhugeint_t>;
      __return_storage_ptr__->select = RLESelect<duckdb::uhugeint_t>;
      __return_storage_ptr__->filter = RLEFilter<duckdb::uhugeint_t>;
      __return_storage_ptr__->fetch_row = RLEFetchRow<duckdb::uhugeint_t>;
      pcVar2 = RLESkip<duckdb::uhugeint_t>;
    }
    else {
      if (iVar1 != 0xcc) goto switchD_0105e6b0_caseD_a;
      __return_storage_ptr__->type = COMPRESSION_RLE;
      __return_storage_ptr__->data_type = INT128;
      __return_storage_ptr__->init_analyze = RLEInitAnalyze<duckdb::hugeint_t>;
      __return_storage_ptr__->analyze = RLEAnalyze<duckdb::hugeint_t>;
      __return_storage_ptr__->final_analyze = RLEFinalAnalyze<duckdb::hugeint_t>;
      __return_storage_ptr__->init_compression = RLEInitCompression<duckdb::hugeint_t,true>;
      __return_storage_ptr__->compress = RLECompress<duckdb::hugeint_t,true>;
      __return_storage_ptr__->compress_finalize = RLEFinalizeCompress<duckdb::hugeint_t,true>;
      __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
      __return_storage_ptr__->init_scan = RLEInitScan<duckdb::hugeint_t>;
      __return_storage_ptr__->scan_vector = RLEScan<duckdb::hugeint_t>;
      __return_storage_ptr__->scan_partial = RLEScanPartial<duckdb::hugeint_t>;
      __return_storage_ptr__->select = RLESelect<duckdb::hugeint_t>;
      __return_storage_ptr__->filter = RLEFilter<duckdb::hugeint_t>;
      __return_storage_ptr__->fetch_row = RLEFetchRow<duckdb::hugeint_t>;
      pcVar2 = RLESkip<duckdb::hugeint_t>;
    }
  }
  __return_storage_ptr__->skip = pcVar2;
  __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
  __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
  __return_storage_ptr__->append = (compression_append_t)0x0;
  __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
  __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
  __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
  __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
  __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction RLEFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL: {
		auto function = GetRLEFunction<int8_t>(type);
		function.filter = nullptr;
		return function;
	}
	case PhysicalType::INT8:
		return GetRLEFunction<int8_t>(type);
	case PhysicalType::INT16:
		return GetRLEFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetRLEFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetRLEFunction<int64_t>(type);
	case PhysicalType::INT128:
		return GetRLEFunction<hugeint_t>(type);
	case PhysicalType::UINT128:
		return GetRLEFunction<uhugeint_t>(type);
	case PhysicalType::UINT8:
		return GetRLEFunction<uint8_t>(type);
	case PhysicalType::UINT16:
		return GetRLEFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetRLEFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetRLEFunction<uint64_t>(type);
	case PhysicalType::FLOAT:
		return GetRLEFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetRLEFunction<double>(type);
	case PhysicalType::LIST:
		return GetRLEFunction<uint64_t, false>(type);
	default:
		throw InternalException("Unsupported type for RLE");
	}
}